

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callLSetup,void *mem)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  N_Vector delta;
  int jbad;
  int retval;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_50;
  int local_4c;
  int local_34;
  
  uVar1 = *(undefined8 *)(*in_RDI + 0x20);
  local_50 = 0;
  *(undefined8 *)(*in_RDI + 0x38) = 0;
  *(undefined8 *)(*in_RDI + 0x40) = 0;
  local_34 = in_R8D;
  while( true ) {
    *(undefined4 *)(*in_RDI + 0x2c) = 0;
    local_4c = (**(code **)*in_RDI)(in_RDX,uVar1,in_R9);
    if ((local_4c != 0) ||
       ((local_34 != 0 &&
        (local_4c = (**(code **)(*in_RDI + 8))(local_50,*in_RDI + 0x28,in_R9), local_4c != 0))))
    break;
    do {
      *(long *)(*in_RDI + 0x38) = *(long *)(*in_RDI + 0x38) + 1;
      N_VScale(0xbff0000000000000,uVar1,uVar1);
      local_4c = (**(code **)(*in_RDI + 0x10))(uVar1,in_R9);
      if (local_4c != 0) break;
      N_VLinearSum(0x3ff0000000000000,in_RDX,uVar1,in_RDX);
      local_4c = (**(code **)(*in_RDI + 0x18))
                           (in_XMM0_Qa,in_RDI,in_RDX,uVar1,in_RCX,*(undefined8 *)(*in_RDI + 0x48));
      *(int *)(*in_RDI + 0x2c) = *(int *)(*in_RDI + 0x2c) + 1;
      if (local_4c == 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0;
        return 0;
      }
      if (local_4c != 0x385) break;
      if (*(int *)(*in_RDI + 0x30) <= *(int *)(*in_RDI + 0x2c)) {
        local_4c = 0x386;
        break;
      }
      local_4c = (**(code **)*in_RDI)(in_RDX,uVar1,in_R9);
    } while (local_4c == 0);
    if (((local_4c < 1) || (*(int *)(*in_RDI + 0x28) != 0)) || (*(long *)(*in_RDI + 8) == 0)) break;
    *(long *)(*in_RDI + 0x40) = *(long *)(*in_RDI + 0x40) + 1;
    local_34 = 1;
    local_50 = 1;
    N_VConst(0,in_RDX);
  }
  *(long *)(*in_RDI + 0x40) = *(long *)(*in_RDI + 0x40) + 1;
  return local_4c;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             SUNDIALS_MAYBE_UNUSED N_Vector y0, N_Vector ycor,
                             N_Vector w, sunrealtype tol,
                             sunbooleantype callLSetup, void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  sunbooleantype jbad;
  N_Vector delta;

  /* check that all required function pointers have been set */
  SUNAssert(NEWTON_CONTENT(NLS)->Sys && NEWTON_CONTENT(NLS)->CTest &&
              NEWTON_CONTENT(NLS)->LSolve,
            SUN_ERR_ARG_CORRUPT);
  SUNAssert(!callLSetup || (callLSetup && NEWTON_CONTENT(NLS)->LSetup),
            SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(NLS->sunctx->logger, "nonlinear-solver", "solver = Newton");

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* initialize iteration and convergence fail counters for this solve */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Perform Newton iteration */
  for (;;)
  {
    SUNLogInfo(NLS->sunctx->logger, "begin-nonlinear-iterate", "");

    /* initialize current iteration counter for this solve attempt */
    NEWTON_CONTENT(NLS)->curiter = 0;

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
    if (retval != SUN_SUCCESS) { break; }

    /* if indicated, setup the linear system */
    if (callLSetup)
    {
      retval = NEWTON_CONTENT(NLS)->LSetup(jbad, &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_SUCCESS) { break; }
    }

    /* looping point for Newton iteration. Break out on any error. */
    for (;;)
    {
      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);
      SUNCheckLastErr();

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(delta, mem);
      if (retval != SUN_SUCCESS) { break; }

      /* update the Newton iterate */
      N_VLinearSum(ONE, ycor, ONE, delta, ycor);
      SUNCheckLastErr();

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                          NEWTON_CONTENT(NLS)->ctest_data);

      NEWTON_CONTENT(NLS)->curiter++;

      SUNLogInfo(NLS->sunctx->logger, "nonlinear-iterate",
                 "cur-iter = %i, total-iters = %li, update-norm = %.16g",
                 NEWTON_CONTENT(NLS)->curiter, NEWTON_CONTENT(NLS)->niters,
                 N_VWrmsNorm(delta, w));

      /* if successful update Jacobian status and return */
      if (retval == SUN_SUCCESS)
      {
        SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                   "status = success");
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return SUN_SUCCESS;
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) { break; }

      /* not yet converged, test for max allowed iterations. */
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters)
      {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = continue");
      SUNLogInfo(NLS->sunctx->logger, "begin-nonlinear-iterate", "");

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
      if (retval != SUN_SUCCESS) { break; }

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count,
       reset the initial correction to zero, and loop again with a call to
       lsetup in which jbad is TRUE. Otherwise break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) &&
        (NEWTON_CONTENT(NLS)->LSetup))
    {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad       = SUNTRUE;
      N_VConst(ZERO, ycor);
      SUNCheckLastErr();

      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = continue");

      continue;
    }
    else
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = failure, retval = %i", retval);
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return (retval);
}